

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Texture.cpp
# Opt level: O1

void __thiscall
GmmLib::GmmGen11TextureCalc::GetMipTailGeometryOffset
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel,uint32_t *OffsetX,
          uint32_t *OffsetY,uint32_t *OffsetZ)

{
  uint32_t uVar1;
  anon_struct_8_44_94931171_for_Info aVar2;
  GMM_MIPTAIL_SLOT_OFFSET (*paGVar3) [5];
  uint uVar4;
  long lVar5;
  
  uVar1 = pTexInfo->BitsPerPixel;
  uVar4 = uVar1 << 0x1d | uVar1 - 8 >> 3;
  if (uVar4 < 8) {
    lVar5 = *(long *)(&DAT_001c84b0 + (ulong)uVar4 * 8);
  }
  else {
    lVar5 = 0;
  }
  switch(pTexInfo->Type) {
  case RESOURCE_1D:
    uVar4 = MipLevel - (pTexInfo->Alignment).MipTailStartLod;
    paGVar3 = Gen11MipTailSlotOffset1DSurface;
    break;
  case RESOURCE_2D:
  case RESOURCE_CUBE:
    aVar2 = (pTexInfo->Flags).Info;
    if (((ulong)aVar2 >> 0x26 & 1) == 0) {
LAB_001b43a8:
      if ((((ulong)aVar2 >> 0x25 & 1) == 0) ||
         ((uVar4 = 0xb, (pTexInfo->MSAA).NumSamples != 0x10 &&
          ((((ulong)aVar2 >> 0x25 & 1) == 0 ||
           ((uVar4 = 10, (pTexInfo->MSAA).NumSamples != 8 &&
            ((((ulong)aVar2 >> 0x25 & 1) == 0 ||
             ((uVar4 = 8, (pTexInfo->MSAA).NumSamples != 4 &&
              ((((ulong)aVar2 >> 0x25 & 1) == 0 || (uVar4 = 5, (pTexInfo->MSAA).NumSamples != 2)))))
             ))))))))) {
        uVar4 = aVar2._4_4_ >> 3 & 4;
      }
    }
    else {
      uVar4 = 4;
      if ((pTexInfo->MSAA).NumSamples != 0x10) {
        if (((ulong)aVar2 >> 0x26 & 1) == 0) goto LAB_001b43a8;
        uVar4 = 3;
        if ((pTexInfo->MSAA).NumSamples != 8) {
          if (((ulong)aVar2 >> 0x26 & 1) == 0) goto LAB_001b43a8;
          uVar4 = 2;
          if ((pTexInfo->MSAA).NumSamples != 4) {
            if (((ulong)aVar2 >> 0x26 & 1) == 0) goto LAB_001b43a8;
            uVar4 = (uint)((pTexInfo->MSAA).NumSamples == 2);
          }
        }
      }
    }
    uVar4 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + uVar4;
    paGVar3 = Gen11MipTailSlotOffset2DSurface;
    break;
  case RESOURCE_3D:
    uVar4 = MipLevel - (pTexInfo->Alignment).MipTailStartLod;
    paGVar3 = Gen11MipTailSlotOffset3DSurface;
    break;
  default:
    goto switchD_001b4397_default;
  }
  *OffsetX = uVar1 * paGVar3[uVar4][lVar5].X >> 3;
  *OffsetY = paGVar3[uVar4][lVar5].Y;
  *OffsetZ = paGVar3[uVar4][lVar5].Z;
switchD_001b4397_default:
  return;
}

Assistant:

void GmmLib::GmmGen11TextureCalc::GetMipTailGeometryOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                           uint32_t          MipLevel,
                                                           uint32_t *        OffsetX,
                                                           uint32_t *        OffsetY,
                                                           uint32_t *        OffsetZ)
{
    uint32_t ArrayIndex = 0;
    uint32_t Slot       = 0;

    GMM_DPF_ENTER;

    switch(pTexInfo->BitsPerPixel)
    {
        case 128:
            ArrayIndex = 0;
            break;
        case 64:
            ArrayIndex = 1;
            break;
        case 32:
            ArrayIndex = 2;
            break;
        case 16:
            ArrayIndex = 3;
            break;
        case 8:
            ArrayIndex = 4;
            break;
        default:
            __GMM_ASSERT(0);
            break;
    }

    if(pTexInfo->Type == RESOURCE_1D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod;

        *OffsetX = Gen11MipTailSlotOffset1DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen11MipTailSlotOffset1DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen11MipTailSlotOffset1DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               // TileYs
               ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 8) ? 3 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 4) ? 2 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 2) ? 1 :
               (pTexInfo->Flags.Info.TiledYs) ? 0 :
               // TileYf
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 16) ? 11 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 8) ? 10 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 4) ? 8 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 2) ? 5 :
               (pTexInfo->Flags.Info.TiledYf) ? 4 : 0);
        // clang-format on

        *OffsetX = Gen11MipTailSlotOffset2DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen11MipTailSlotOffset2DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen11MipTailSlotOffset2DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_3D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod;

        *OffsetX = Gen11MipTailSlotOffset3DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen11MipTailSlotOffset3DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen11MipTailSlotOffset3DSurface[Slot][ArrayIndex].Z;
    }

    GMM_DPF_EXIT;
    return;
}